

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTest::initPrograms
          (AdvGraphicsTest *this,SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  BasicGraphicsTest::initPrograms(&this->super_BasicGraphicsTest,programCollection);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dummy_geo",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\n#extension GL_EXT_geometry_shader : enable\nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(location = 0) in highp vec4 in_vtxColor[];\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n  for(int ndx=0; ndx<3; ndx++)\n  {\n    gl_Position = gl_in[ndx].gl_Position;\n    vtxColor    = in_vtxColor[ndx];\n    EmitVertex();\n  }\n  EndPrimitive();\n}\n"
             ,&local_7a);
  glu::GeometrySource::GeometrySource((GeometrySource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"basic_tcs",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\n#extension GL_EXT_tessellation_shader : enable\nlayout(vertices = 3) out;\nlayout(location = 0) in highp vec4 color[];\nlayout(location = 0) out highp vec4 vtxColor[];\nvoid main()\n{\n  gl_TessLevelOuter[0] = 4.0;\n  gl_TessLevelOuter[1] = 4.0;\n  gl_TessLevelOuter[2] = 4.0;\n  gl_TessLevelInner[0] = 4.0;\n  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n}\n"
             ,&local_7a);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"basic_tes",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\n#extension GL_EXT_tessellation_shader : enable\nlayout(triangles, fractional_even_spacing, ccw) in;\nlayout(location = 0) in highp vec4 colors[];\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main() \n{\n  float u = gl_TessCoord.x;\n  float v = gl_TessCoord.y;\n  float w = gl_TessCoord.z;\n  vec4 pos = vec4(0);\n  vec4 color = vec4(0);\n  pos.xyz += u * gl_in[0].gl_Position.xyz;\n  color.xyz += u * colors[0].xyz;\n  pos.xyz += v * gl_in[1].gl_Position.xyz;\n  color.xyz += v * colors[1].xyz;\n  pos.xyz += w * gl_in[2].gl_Position.xyz;\n  color.xyz += w * colors[2].xyz;\n  pos.w = 1.0;\n  color.w = 1.0;\n  gl_Position = pos;\n  vtxColor = color;\n}\n"
             ,&local_7a);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AdvGraphicsTest::initPrograms(SourceCollections& programCollection) const
{
	BasicGraphicsTest::initPrograms(programCollection);

	programCollection.glslSources.add("dummy_geo") << glu::GeometrySource(
		"#version 310 es\n"
		"#extension GL_EXT_geometry_shader : enable\n"
		"layout(triangles) in;\n"
		"layout(triangle_strip, max_vertices = 3) out;\n"
		"layout(location = 0) in highp vec4 in_vtxColor[];\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"  for(int ndx=0; ndx<3; ndx++)\n"
		"  {\n"
		"    gl_Position = gl_in[ndx].gl_Position;\n"
		"    vtxColor    = in_vtxColor[ndx];\n"
		"    EmitVertex();\n"
		"  }\n"
		"  EndPrimitive();\n"
		"}\n");

	programCollection.glslSources.add("basic_tcs") << glu::TessellationControlSource(
		"#version 310 es\n"
		"#extension GL_EXT_tessellation_shader : enable\n"
		"layout(vertices = 3) out;\n"
		"layout(location = 0) in highp vec4 color[];\n"
		"layout(location = 0) out highp vec4 vtxColor[];\n"
		"void main()\n"
		"{\n"
		"  gl_TessLevelOuter[0] = 4.0;\n"
		"  gl_TessLevelOuter[1] = 4.0;\n"
		"  gl_TessLevelOuter[2] = 4.0;\n"
		"  gl_TessLevelInner[0] = 4.0;\n"
		"  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
		"  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n"
		"}\n");

	programCollection.glslSources.add("basic_tes") << glu::TessellationEvaluationSource(
		"#version 310 es\n"
		"#extension GL_EXT_tessellation_shader : enable\n"
		"layout(triangles, fractional_even_spacing, ccw) in;\n"
		"layout(location = 0) in highp vec4 colors[];\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main() \n"
		"{\n"
		"  float u = gl_TessCoord.x;\n"
		"  float v = gl_TessCoord.y;\n"
		"  float w = gl_TessCoord.z;\n"
		"  vec4 pos = vec4(0);\n"
		"  vec4 color = vec4(0);\n"
		"  pos.xyz += u * gl_in[0].gl_Position.xyz;\n"
		"  color.xyz += u * colors[0].xyz;\n"
		"  pos.xyz += v * gl_in[1].gl_Position.xyz;\n"
		"  color.xyz += v * colors[1].xyz;\n"
		"  pos.xyz += w * gl_in[2].gl_Position.xyz;\n"
		"  color.xyz += w * colors[2].xyz;\n"
		"  pos.w = 1.0;\n"
		"  color.w = 1.0;\n"
		"  gl_Position = pos;\n"
		"  vtxColor = color;\n"
		"}\n");
}